

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

void Bbl_ManSortCubes(char **pCubes,int nCubes,int nVars)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (1 < nCubes) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uVar8 = uVar5 & 0xffffffff;
      uVar7 = uVar6;
      do {
        iVar3 = memcmp(pCubes[uVar7],pCubes[(int)(uint)uVar8],(long)nVars);
        uVar4 = (uint)uVar7;
        if (-1 < iVar3) {
          uVar4 = (uint)uVar8;
        }
        uVar7 = uVar7 + 1;
        uVar8 = (ulong)uVar4;
      } while ((uint)nCubes != uVar7);
      pcVar2 = pCubes[uVar5];
      pCubes[uVar5] = pCubes[(int)uVar4];
      pCubes[(int)uVar4] = pcVar2;
      uVar6 = uVar6 + 1;
      uVar5 = uVar1;
    } while (uVar1 != nCubes - 1);
  }
  return;
}

Assistant:

void Bbl_ManSortCubes( char ** pCubes, int nCubes, int nVars )
{
    char * pTemp;
    int i, j, best_i;
    for ( i = 0; i < nCubes-1; i++ )
    {
        best_i = i;
        for (j = i+1; j < nCubes; j++)
            if ( memcmp( pCubes[j], pCubes[best_i], (size_t)nVars ) < 0 )
                best_i = j;
        pTemp = pCubes[i]; pCubes[i] = pCubes[best_i]; pCubes[best_i] = pTemp;
    }
}